

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::cmCTestBZR(cmCTestBZR *this,cmCTest *ct,ostream *log)

{
  allocator local_31;
  string local_30;
  
  cmCTestGlobalVC::cmCTestGlobalVC(&this->super_cmCTestGlobalVC,ct,log);
  (this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC =
       (_func_int **)&PTR__cmCTestBZR_0072b518;
  (this->URL)._M_dataplus._M_p = (pointer)&(this->URL).field_2;
  (this->URL)._M_string_length = 0;
  (this->URL).field_2._M_local_buf[0] = '\0';
  cmCTestVC::Revision::operator=
            (&(this->super_cmCTestGlobalVC).PriorRev,
             &(this->super_cmCTestGlobalVC).super_cmCTestVC.Unknown);
  std::__cxx11::string::string((string *)&local_30,"BZR_PROGRESS_BAR=none",&local_31);
  cmsys::SystemTools::PutEnv(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

cmCTestBZR::cmCTestBZR(cmCTest* ct, std::ostream& log)
  : cmCTestGlobalVC(ct, log)
{
  this->PriorRev = this->Unknown;
  // Even though it is specified in the documentation, with bzr 1.13
  // BZR_PROGRESS_BAR has no effect. In the future this bug might be fixed.
  // Since it doesn't hurt, we specify this environment variable.
  cmSystemTools::PutEnv("BZR_PROGRESS_BAR=none");
}